

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HMPSIO.cpp
# Opt level: O1

int writeMPS_dense(char *filename,int *numRow,int *numCol,int *objSense,double *objOffset,
                  vector<double,_std::allocator<double>_> *A_cw,
                  vector<double,_std::allocator<double>_> *rhs,
                  vector<double,_std::allocator<double>_> *cost,
                  vector<double,_std::allocator<double>_> *lb,
                  vector<double,_std::allocator<double>_> *ub,
                  vector<int,_std::allocator<int>_> *integerColumn)

{
  double dVar1;
  uint uVar2;
  pointer pdVar3;
  int iVar4;
  long lVar5;
  ulong uVar6;
  long lVar7;
  int iVar8;
  ulong uVar9;
  vector<double,_std::allocator<double>_> Avalue;
  vector<int,_std::allocator<int>_> Aindex;
  vector<int,_std::allocator<int>_> Astart;
  
  uVar9 = 0;
  printf("writeMPS_dense: Model has %d rows and %d columns\n",(ulong)(uint)*numRow,
         (ulong)(uint)*numCol);
  printf("writeMPS_dense: Objective sense is %d; Objective offset is %g\n",*objOffset,
         (ulong)(uint)*objSense);
  std::ostream::flush();
  Astart.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  Astart.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  Astart.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  Aindex.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  Aindex.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  Aindex.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  Avalue.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  Avalue.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  Avalue.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  if (0 < (long)*numCol) {
    uVar2 = *numRow;
    pdVar3 = (A_cw->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_start;
    lVar5 = 0;
    uVar9 = 0;
    do {
      if (0 < (int)uVar2) {
        uVar6 = 0;
        do {
          uVar9 = (ulong)((int)uVar9 + (uint)(pdVar3[uVar6] != 0.0));
          uVar6 = uVar6 + 1;
        } while (uVar2 != uVar6);
      }
      lVar5 = lVar5 + 1;
      pdVar3 = pdVar3 + uVar2;
    } while (lVar5 != *numCol);
  }
  printf("Model has %d nonzeros\n",uVar9);
  std::ostream::flush();
  std::vector<int,_std::allocator<int>_>::resize(&Astart,(long)*numCol + 1);
  std::vector<int,_std::allocator<int>_>::resize(&Aindex,(long)(int)uVar9);
  std::vector<double,_std::allocator<double>_>::resize(&Avalue,(long)(int)uVar9);
  *Astart.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start = 0
  ;
  if (0 < *numCol) {
    pdVar3 = (A_cw->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_start;
    lVar5 = 0;
    do {
      iVar4 = Astart.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
              _M_start[lVar5];
      iVar8 = *numRow;
      if (0 < iVar8) {
        lVar7 = 0;
        do {
          dVar1 = pdVar3[iVar8 * (int)lVar5 + lVar7];
          if ((dVar1 != 0.0) || (NAN(dVar1))) {
            Aindex.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start[iVar4] = (int)lVar7;
            Avalue.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start[iVar4] = dVar1;
            iVar4 = iVar4 + 1;
          }
          iVar8 = *numRow;
          lVar7 = lVar7 + 1;
        } while ((int)lVar7 < iVar8);
      }
      Astart.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
      [lVar5 + 1] = iVar4;
      lVar5 = lVar5 + 1;
    } while (lVar5 < *numCol);
  }
  puts("writeMPS_dense: calling writeMPS_sparse");
  std::ostream::flush();
  iVar4 = writeMPS_sparse(filename,numRow,numCol,objSense,objOffset,&Astart,&Aindex,&Avalue,rhs,cost
                          ,lb,ub,integerColumn);
  if (Avalue.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(Avalue.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (Aindex.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
      != (pointer)0x0) {
    operator_delete(Aindex.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (Astart.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
      != (pointer)0x0) {
    operator_delete(Astart.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return iVar4;
}

Assistant:

int writeMPS_dense(const char *filename, int& numRow, int& numCol, int& objSense, double& objOffset,
		   vector<double>& A_cw,
		   vector<double>& rhs, vector<double>& cost, vector<double>& lb, vector<double>& ub,
		   vector<int>& integerColumn) {
#ifdef JAJH_dev
  printf("writeMPS_dense: Model has %d rows and %d columns\n", numRow, numCol);
  printf("writeMPS_dense: Objective sense is %d; Objective offset is %g\n", objSense, objOffset);
  cout<<flush;
#endif
  
  vector<int> Astart;
  vector<int> Aindex;
  vector<double> Avalue;
  int numNz = 0;
  for (int c_n = 0; c_n<numCol; c_n++) {
    for (int r_n = 0; r_n<numRow; r_n++) {
      double r_v = A_cw[r_n+c_n*numRow];
      if (r_v != 0) numNz++;
    }
  }
  printf("Model has %d nonzeros\n", numNz);cout<<flush;
  Astart.resize(numCol+1);
  Aindex.resize(numNz);
  Avalue.resize(numNz);
  Astart[0] = 0;
  for (int c_n = 0; c_n<numCol; c_n++) {
    int el_n = Astart[c_n];
    for (int r_n = 0; r_n<numRow; r_n++) {
      double r_v = A_cw[r_n+c_n*numRow];
      if (r_v != 0) {
  	Aindex[el_n] = r_n;
  	Avalue[el_n] = r_v;
  	el_n++;
      }
    }
    Astart[c_n+1] = el_n;
  }
  printf("writeMPS_dense: calling writeMPS_sparse\n"); cout<<flush;
  int rtCd = writeMPS_sparse(filename, numRow, numCol, objSense, objOffset,
			    Astart, Aindex, Avalue,
			    rhs, cost, lb, ub,
			    integerColumn);
  return rtCd;
}